

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O1

NodeSequence __thiscall
GraphBuilder::buildGeneralCallInstruction(GraphBuilder *this,CallInst *callInstruction)

{
  long lVar1;
  long lVar2;
  CallNode *this_00;
  CallInst *callInst;
  NodeSequence NVar3;
  
  lVar1 = *(long *)(callInstruction + -0x20);
  lVar2 = 0;
  if ((lVar1 != 0) && (*(char *)(lVar1 + 0x10) == '\0')) {
    lVar2 = lVar1;
  }
  if ((lVar2 == 0) || (*(long *)(lVar2 + 0x18) != *(long *)(callInstruction + 0x48))) {
    this_00 = (CallNode *)operator_new(0x80);
    callInst = callInstruction;
    callInstruction = (CallInst *)(Instruction *)0x0;
  }
  else {
    this_00 = (CallNode *)operator_new(0x80);
    callInst = (CallInst *)0x0;
  }
  CallNode::CallNode(this_00,(Instruction *)callInstruction,callInst);
  NVar3.first = &addNode<CallNode>(this,this_00)->super_Node;
  NVar3.second = NVar3.first;
  return NVar3;
}

Assistant:

GraphBuilder::NodeSequence
GraphBuilder::buildGeneralCallInstruction(const CallInst *callInstruction) {
    CallNode *callNode;
    if (callInstruction->getCalledFunction()) {
        callNode = addNode(createNode<NodeType::CALL>(callInstruction));
    } else {
        callNode =
                addNode(createNode<NodeType::CALL>(nullptr, callInstruction));
    }
    return {callNode, callNode};
}